

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall cfd::core::TapBranch::TapBranch(TapBranch *this,TapBranch *tap_tree)

{
  TapBranch *tap_tree_local;
  TapBranch *this_local;
  
  this->_vptr_TapBranch = (_func_int **)&PTR__TapBranch_009f82e8;
  Script::Script(&this->script_);
  ByteData256::ByteData256(&this->root_commitment_);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::vector
            (&this->branch_list_);
  this->has_leaf_ = (bool)(tap_tree->has_leaf_ & 1);
  this->leaf_version_ = tap_tree->leaf_version_;
  Script::operator=(&this->script_,&tap_tree->script_);
  ByteData256::operator=(&this->root_commitment_,&tap_tree->root_commitment_);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
            (&this->branch_list_,&tap_tree->branch_list_);
  return;
}

Assistant:

TapBranch::TapBranch(const TapBranch& tap_tree) {
  has_leaf_ = tap_tree.has_leaf_;
  leaf_version_ = tap_tree.leaf_version_;
  script_ = tap_tree.script_;
  root_commitment_ = tap_tree.root_commitment_;
  branch_list_ = tap_tree.branch_list_;
}